

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::parse_metadata_record
          (ModuleParseContext *this,BlockOrRecord *entry,uint index)

{
  uint64_t id;
  LLVMContext *this_00;
  undefined8 uVar1;
  MDNode *pMVar2;
  bool bVar3;
  size_type sVar4;
  NamedMDNode *node_00;
  mapped_type *ppMVar5;
  MDString *pMVar6;
  Value *value_00;
  LoggingCallback p_Var7;
  void *pvVar8;
  ConstantAsMetadata *pCVar9;
  const_reference pvVar10;
  mapped_type *this_01;
  String local_2178;
  ulong local_2158;
  ConstantAsMetadata *local_2150;
  ConstantAsMetadata *node_4;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  Constant *constant_value;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Value *value;
  String local_118;
  MDString *local_f8;
  MDString *node_3;
  MDNode *local_e8;
  MDNode *node_2;
  MDOperand *md_1;
  unsigned_long *op_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  Vector<uint64_t> *__range3_1;
  Vector<MDOperand_*> ops_1;
  NamedMDNode *node;
  MDNode *node_1;
  MDOperand *md;
  unsigned_long *op;
  const_iterator __end3;
  const_iterator __begin3;
  Vector<uint64_t> *__range3;
  Vector<MDNode_*> ops;
  uint index_local;
  BlockOrRecord *entry_local;
  ModuleParseContext *this_local;
  
  switch(entry->id) {
  case 1:
    this_00 = this->context;
    BlockOrRecord::getString_abi_cxx11_(&local_118,entry,0);
    pMVar6 = LLVMContext::
             construct<LLVMBC::MDString,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
                       (this_00,&this->module,&local_118);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_118);
    value = (Value *)(ulong)index;
    local_f8 = pMVar6;
    ppMVar5 = std::
              unordered_map<unsigned_long,_LLVMBC::MDOperand_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>_>
              ::operator[](&this->metadata,(key_type *)&value);
    *ppMVar5 = &pMVar6->super_MDOperand;
    break;
  case 2:
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&entry->ops);
    if (sVar4 < 2) {
      return false;
    }
    pvVar10 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                        (&entry->ops,1);
    value_00 = get_value(this,*pvVar10,(Type *)0x0,true);
    if (value_00 == (Value *)0x0) {
      p_Var7 = dxil_spv::get_thread_log_callback();
      if (p_Var7 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Null value!\n");
        fflush(_stderr);
      }
      else {
        snprintf((char *)&constant_value,0x1000,"Null value!\n");
        pvVar8 = dxil_spv::get_thread_log_callback_userdata();
        (*p_Var7)(pvVar8,Error,(char *)&constant_value);
      }
      return false;
    }
    cb_1 = (_func_void_void_ptr_LogLevel_char_ptr *)dyn_cast<LLVMBC::Constant>(value_00);
    if ((Constant *)cb_1 == (Constant *)0x0) {
      buffer_1._4088_8_ = dxil_spv::get_thread_log_callback();
      if ((LoggingCallback)buffer_1._4088_8_ == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Not a constant!\n");
        fflush(_stderr);
      }
      else {
        snprintf((char *)&node_4,0x1000,"Not a constant!\n");
        uVar1 = buffer_1._4088_8_;
        pvVar8 = dxil_spv::get_thread_log_callback_userdata();
        (*(code *)uVar1)(pvVar8,2,&node_4);
      }
      return false;
    }
    pCVar9 = LLVMContext::construct<LLVMBC::ConstantAsMetadata,LLVMBC::Module*&,LLVMBC::Constant*&>
                       (this->context,&this->module,(Constant **)&cb_1);
    local_2158 = (ulong)index;
    local_2150 = pCVar9;
    ppMVar5 = std::
              unordered_map<unsigned_long,_LLVMBC::MDOperand_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>_>
              ::operator[](&this->metadata,&local_2158);
    *ppMVar5 = &pCVar9->super_MDOperand;
    break;
  case 3:
  case 5:
    std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::vector
              ((vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *)
               &__range3_1);
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&entry->ops);
    std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::reserve
              ((vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *)
               &__range3_1,sVar4);
    __end3_1 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::begin
                         (&entry->ops);
    op_1 = (unsigned_long *)
           std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::end
                     (&entry->ops);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>_>
                               *)&op_1), bVar3) {
      md_1 = (MDOperand *)
             __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>_>
             ::operator*(&__end3_1);
      node_2 = (MDNode *)
               get_metadata(this,(uint64_t)
                                 ((long)&md_1->parent[-1].unnamed_metadata.
                                         super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::
      push_back((vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *
                )&__range3_1,(value_type *)&node_2);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>_>
      ::operator++(&__end3_1);
    }
    local_e8 = LLVMContext::
               construct<LLVMBC::MDNode,LLVMBC::Module*&,std::vector<LLVMBC::MDOperand*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand*>>>
                         (this->context,&this->module,
                          (vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
                           *)&__range3_1);
    id = this->metadata_tween_id;
    this->metadata_tween_id = id + 1;
    MDNode::set_tween_id(local_e8,id);
    Module::add_unnamed_metadata(this->module,local_e8);
    pMVar2 = local_e8;
    node_3 = (MDString *)(ulong)index;
    ppMVar5 = std::
              unordered_map<unsigned_long,_LLVMBC::MDOperand_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>_>
              ::operator[](&this->metadata,(key_type *)&node_3);
    *ppMVar5 = &pMVar2->super_MDOperand;
    std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::~vector
              ((vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *)
               &__range3_1);
    break;
  case 4:
    BlockOrRecord::getString_abi_cxx11_
              ((String *)
               &ops.
                super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,entry,0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&this->current_metadata_name,
                (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&ops.
                  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)&ops.
                        super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case 6:
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&entry->ops);
    if (sVar4 == 0) {
      return false;
    }
    BlockOrRecord::getString_abi_cxx11_(&local_2178,entry,1);
    pvVar10 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                        (&entry->ops,0);
    this_01 = std::
              unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
              ::operator[](&this->metadata_kind_map,pvVar10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(this_01,&local_2178);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_2178);
    break;
  default:
    break;
  case 10:
    std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::vector
              ((vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)
               &__range3);
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&entry->ops);
    std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::reserve
              ((vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)
               &__range3,sVar4);
    __end3 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::begin
                       (&entry->ops);
    op = (unsigned_long *)
         std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::end
                   (&entry->ops);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>_>
                                       *)&op), bVar3) {
      md = (MDOperand *)
           __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>_>
           ::operator*(&__end3);
      node_1 = (MDNode *)get_metadata(this,(uint64_t)md->parent);
      node = (NamedMDNode *)dyn_cast<LLVMBC::MDNode>((MDOperand *)node_1);
      std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::push_back
                ((vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)
                 &__range3,(value_type *)&node);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>_>
      ::operator++(&__end3);
    }
    node_00 = LLVMContext::
              construct<LLVMBC::NamedMDNode,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>&,std::vector<LLVMBC::MDNode*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode*>>>
                        (this->context,&this->module,&this->current_metadata_name,
                         (vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>
                          *)&__range3);
    Module::add_named_metadata(this->module,&this->current_metadata_name,node_00);
    ops_1.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)index;
    ppMVar5 = std::
              unordered_map<unsigned_long,_LLVMBC::MDOperand_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>_>
              ::operator[](&this->metadata,
                           (key_type *)
                           &ops_1.
                            super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *ppMVar5 = &node_00->super_MDOperand;
    std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::~vector
              ((vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)
               &__range3);
  }
  return true;
}

Assistant:

bool ModuleParseContext::parse_metadata_record(const BlockOrRecord &entry, unsigned index)
{
	switch (MetaDataRecord(entry.id))
	{
	case MetaDataRecord::NAME:
	{
		current_metadata_name = entry.getString();
		break;
	}

	case MetaDataRecord::NAMED_NODE:
	{
		Vector<MDNode *> ops;
		ops.reserve(entry.ops.size());
		for (auto &op : entry.ops)
		{
			auto *md = get_metadata(op);
			auto *node = dyn_cast<MDNode>(md);
			ops.push_back(node);
		}

		auto *node = context->construct<NamedMDNode>(module, current_metadata_name, std::move(ops));
		module->add_named_metadata(current_metadata_name, node);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::DISTINCT_NODE:
	case MetaDataRecord::NODE:
	{
		Vector<MDOperand *> ops;
		ops.reserve(entry.ops.size());
		for (auto &op : entry.ops)
		{
			// For some reason, here metadata is indexed with -1?
			auto *md = get_metadata(op - 1);
			ops.push_back(md);
		}

		auto *node = context->construct<MDNode>(module, std::move(ops));
		node->set_tween_id(metadata_tween_id++);
		module->add_unnamed_metadata(node);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::STRING_OLD:
	{
		auto *node = context->construct<MDString>(module, entry.getString());
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::VALUE:
	{
		if (entry.ops.size() < 2)
			return false;

		auto *value = get_value(entry.ops[1], nullptr, true);
		if (!value)
		{
			LOGE("Null value!\n");
			return false;
		}

		auto *constant_value = dyn_cast<Constant>(value);
		if (!constant_value)
		{
			LOGE("Not a constant!\n");
			return false;
		}

		auto *node = context->construct<ConstantAsMetadata>(module, constant_value);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::KIND:
	{
		if (entry.ops.size() < 1)
			return false;

		metadata_kind_map[entry.ops[0]] = entry.getString(1);
		break;
	}

	default:
		break;
	}

	return true;
}